

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O0

string_t duckdb::CastFromBitToString::Operation<duckdb::string_t>(string_t input,Vector *vector)

{
  bitstring_t bits;
  bitstring_t bits_00;
  anon_union_16_2_67f50693_for_value aVar1;
  string_t *in_RSI;
  char *in_RDI;
  string_t sVar2;
  idx_t result_size;
  string_t result;
  idx_t in_stack_ffffffffffffff98;
  Vector *in_stack_ffffffffffffffa0;
  string_t *psVar3;
  undefined8 uVar4;
  undefined8 local_8;
  
  bits.value.pointer.ptr = (char *)in_stack_ffffffffffffffa0;
  bits.value._0_8_ = in_stack_ffffffffffffff98;
  Bit::BitLength(bits);
  sVar2 = StringVector::EmptyString(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  uVar4 = sVar2.value._0_8_;
  local_8 = sVar2.value._8_8_;
  psVar3 = in_RSI;
  string_t::GetDataWriteable((string_t *)&stack0xfffffffffffffff0);
  bits_00.value.pointer.ptr = (char *)uVar4;
  bits_00.value._0_8_ = psVar3;
  Bit::ToString(bits_00,in_RDI);
  string_t::Finalize(in_RSI);
  aVar1.pointer.ptr = (char *)local_8;
  aVar1._0_8_ = uVar4;
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
}

Assistant:

string_t CastFromBitToString::Operation(string_t input, Vector &vector) {

	idx_t result_size = Bit::BitLength(input);
	string_t result = StringVector::EmptyString(vector, result_size);
	Bit::ToString(input, result.GetDataWriteable());
	result.Finalize();

	return result;
}